

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O1

int compare_list(char **name,void **list,zip_uint64_t *list_length,int element_size,
                _func_int_void_ptr_void_ptr *cmp,_func_int_void_ptr_int_void_ptr *ignore,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_char_void_ptr *print,
                _func_void_void_ptr *start_file)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  uint local_68;
  uint auStack_4c [3];
  char **local_40;
  _func_int_void_ptr_void_ptr *local_38;
  
  local_40 = name;
  auStack_4c[1] = 0;
  auStack_4c[2] = 0;
  uVar9 = (ulong)(uint)element_size;
  if (*list_length == 0) {
    uVar11 = 0;
    uVar6 = 0;
    local_68 = 0;
  }
  else {
    ppvVar1 = list + 1;
    uVar6 = 0;
    local_68 = 0;
    uVar11 = 0;
    local_38 = cmp;
    do {
      uVar5 = (ulong)uVar11;
      if (list_length[1] <= uVar5) break;
      iVar2 = (*cmp)(*list,list[1]);
      ppvVar4 = ppvVar1;
      if (iVar2 == 0) {
        if (check != (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0) {
          if (start_file != (_func_void_void_ptr *)0x0) {
            (*start_file)(*list);
          }
          uVar3 = (*check)(local_40,*list,list[1]);
          local_68 = uVar3 | local_68;
          if (start_file != (_func_void_void_ptr *)0x0) {
            diff_output_end_file(&output);
          }
        }
        *list = (void *)((long)*list + uVar9);
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar11 = uVar11 + 1;
        cmp = local_38;
      }
      else if (iVar2 < 0) {
        if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_00103402:
          (*print)('-',*list);
          minus_count = minus_count + 1;
          local_68 = 1;
        }
        else {
          if (uVar5 < list_length[1]) {
            pvVar7 = *ppvVar1;
          }
          else {
            pvVar7 = (void *)0x0;
          }
          iVar2 = (*ignore)(*list,SUB14(*list_length - 1 <= uVar6,0),pvVar7);
          if (iVar2 == 0) goto LAB_00103402;
        }
        uVar6 = (ulong)((int)uVar6 + 1);
        ppvVar4 = list;
      }
      else {
        if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_001033c1:
          (*print)('+',*ppvVar1);
          plus_count = plus_count + 1;
          local_68 = 1;
        }
        else {
          if (uVar6 < *list_length) {
            pvVar7 = *list;
          }
          else {
            pvVar7 = (void *)0x0;
          }
          iVar2 = (*ignore)(*ppvVar1,SUB14(list_length[1] - 1 <= uVar5,0),pvVar7);
          if (iVar2 == 0) goto LAB_001033c1;
        }
        uVar11 = uVar11 + 1;
      }
      *ppvVar4 = (void *)((long)*ppvVar4 + uVar9);
    } while (uVar6 < *list_length);
  }
  auStack_4c[1] = (uint)uVar6;
  auStack_4c[2] = uVar11;
  lVar10 = 0;
  do {
    uVar11 = auStack_4c[lVar10 + 1];
    uVar5 = (ulong)uVar11;
    uVar6 = list_length[lVar10];
    if (uVar5 < uVar6) {
      lVar12 = -lVar10 + 1;
      piVar8 = &plus_count;
      if (lVar10 == 0) {
        piVar8 = &minus_count;
      }
      do {
        uVar11 = uVar11 + 1;
        if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_001034d3:
          (*print)((lVar10 == 0) * '\x02' + '+',list[lVar10]);
          *piVar8 = *piVar8 + 1;
          local_68 = 1;
        }
        else {
          if ((ulong)auStack_4c[-lVar10 + 2] < list_length[lVar12]) {
            pvVar7 = list[lVar12];
          }
          else {
            pvVar7 = (void *)0x0;
          }
          iVar2 = (*ignore)(list[lVar10],SUB14(uVar6 - 1 <= uVar5,0),pvVar7);
          if (iVar2 == 0) goto LAB_001034d3;
        }
        auStack_4c[lVar10 + 1] = uVar11;
        list[lVar10] = (void *)((long)list[lVar10] + uVar9);
        uVar5 = (ulong)uVar11;
        uVar6 = list_length[lVar10];
      } while (uVar5 < uVar6);
    }
    bVar13 = lVar10 != 0;
    lVar10 = lVar10 + 1;
    if (bVar13) {
      return local_68;
    }
  } while( true );
}

Assistant:

static int
compare_list(char *const name[2], const void *list[2], const zip_uint64_t list_length[2], int element_size, int (*cmp)(const void *a, const void *b), int (*ignore)(const void *list, int last, const void *other), int (*check)(char *const name[2], const void *a, const void *b), void (*print)(char side, const void *element), void (*start_file)(const void *element)) {
    unsigned int i[2];
    int j;
    int diff;

#define INC(k) (i[k]++, list[k] = ((const char *)list[k]) + element_size)
#define PRINT(k)                                                                                                         \
    do {                                                                                                                 \
        if (ignore && ignore(list[k], i[k] >= list_length[k] - 1, i[1 - k] < list_length[1 - k] ? list[1 - k] : NULL)) { \
            break;                                                                                                       \
        }                                                                                                                \
        print((k) ? '+' : '-', list[k]);                                                                                 \
        (k) ? plus_count++ : minus_count++;                                                                              \
        diff = 1;                                                                                                        \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < list_length[0] && i[1] < list_length[1]) {
        int c = cmp(list[0], list[1]);

        if (c == 0) {
            if (check) {
                if (start_file) {
                    start_file(list[0]);
                }
                diff |= check(name, list[0], list[1]);
                if (start_file) {
                    diff_output_end_file(&output);
                }
            }
            INC(0);
            INC(1);
        }
        else if (c < 0) {
            PRINT(0);
            INC(0);
        }
        else {
            PRINT(1);
            INC(1);
        }
    }

    for (j = 0; j < 2; j++) {
        while (i[j] < list_length[j]) {
            PRINT(j);
            INC(j);
        }
    }

    return diff;
}